

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O0

void biffnd(bifcxdef *ctx,int argc)

{
  char cVar1;
  long lVar2;
  void *pvVar3;
  undefined8 uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  void *pvVar9;
  long in_RDI;
  int siz;
  int typ;
  runsdef val;
  int outv;
  int len2;
  int len1;
  uchar *p2;
  uchar *p1;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  runcxdef *in_stack_ffffffffffffff70;
  void *in_stack_ffffffffffffff78;
  dattyp typ_00;
  undefined4 in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  char local_40;
  ushort local_38;
  int local_24;
  char *local_18;
  
  cVar1 = *(char *)(*(long *)(*(long *)(in_RDI + 8) + 0x20) + -0x10);
  if (cVar1 == '\x03') {
    lVar2 = *(long *)(*(long *)(in_RDI + 8) + 0x20);
    *(long *)(*(long *)(in_RDI + 8) + 0x20) = lVar2 + -0x10;
    if (*(char *)(lVar2 + -0x10) != '\x03') {
      *(undefined4 *)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x68) = 0;
      runsign(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
    }
    pvVar3 = *(void **)(*(long *)(*(long *)(in_RDI + 8) + 0x20) + 8);
    local_24 = osrp2(pvVar3);
    local_24 = local_24 + -2;
    local_18 = (char *)((long)pvVar3 + 2);
    lVar2 = *(long *)(*(long *)(in_RDI + 8) + 0x20);
    *(long *)(*(long *)(in_RDI + 8) + 0x20) = lVar2 + -0x10;
    if (*(char *)(lVar2 + -0x10) != '\x03') {
      *(undefined4 *)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x68) = 0;
      runsign(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
    }
    pvVar3 = *(void **)(*(long *)(*(long *)(in_RDI + 8) + 0x20) + 8);
    iVar5 = osrp2(pvVar3);
    for (; typ_00 = (dattyp)((ulong)in_stack_ffffffffffffff78 >> 0x20), iVar5 + -2 <= local_24;
        local_24 = local_24 + -1) {
      iVar6 = memcmp(local_18,(void *)((long)pvVar3 + 2),(long)(iVar5 + -2));
      typ_00 = (dattyp)((ulong)in_stack_ffffffffffffff78 >> 0x20);
      if (iVar6 == 0) break;
      local_18 = (char *)((long)local_18 + 1);
    }
  }
  else {
    if (cVar1 != '\a') {
      *(char **)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x18) = "find";
      *(undefined4 *)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x68) = 1;
      runsign(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
    }
    lVar2 = *(long *)(*(long *)(in_RDI + 8) + 0x20);
    *(long *)(*(long *)(in_RDI + 8) + 0x20) = lVar2 + -0x10;
    if (*(char *)(lVar2 + -0x10) != '\a') {
      *(undefined4 *)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x68) = 0;
      runsign(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
    }
    pvVar3 = *(void **)(*(long *)(*(long *)(in_RDI + 8) + 0x20) + 8);
    local_24 = osrp2(pvVar3);
    local_18 = (char *)((long)pvVar3 + 2);
    lVar2 = *(long *)(*(long *)(in_RDI + 8) + 0x20);
    *(long *)(*(long *)(in_RDI + 8) + 0x20) = lVar2 + -0x10;
    uVar4 = *(undefined8 *)(lVar2 + -0x10);
    pvVar3 = *(void **)(lVar2 + -8);
    for (local_24 = local_24 + -2; typ_00 = (dattyp)((ulong)in_stack_ffffffffffffff78 >> 0x20),
        local_24 != 0; local_24 = local_24 - (uVar7 + 1)) {
      uVar7 = datsiz((dattyp)in_stack_ffffffffffffff70,
                     (void *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      typ_00 = (dattyp)((ulong)in_stack_ffffffffffffff78 >> 0x20);
      local_40 = (char)uVar4;
      if (local_40 == *local_18) {
        local_38 = (ushort)pvVar3;
        switch(local_40) {
        case '\x01':
          pvVar9 = (void *)osrp4s(local_18 + 1);
          typ_00 = (dattyp)((ulong)in_stack_ffffffffffffff78 >> 0x20);
          if (pvVar3 == pvVar9) goto LAB_00137ea8;
          break;
        case '\x02':
        case '\n':
          uVar8 = osrp2(local_18 + 1);
          typ_00 = (dattyp)((ulong)in_stack_ffffffffffffff78 >> 0x20);
          if (uVar8 == local_38) goto LAB_00137ea8;
          break;
        case '\x03':
        case '\a':
          in_stack_ffffffffffffff84 = osrp2(local_18 + 1);
          iVar5 = osrp2(pvVar3);
          if (in_stack_ffffffffffffff84 == iVar5) {
            in_stack_ffffffffffffff70 = (runcxdef *)(local_18 + 3);
            in_stack_ffffffffffffff78 = (void *)((long)pvVar3 + 2);
            iVar5 = osrp2(local_18 + 1);
            iVar5 = memcmp(in_stack_ffffffffffffff70,in_stack_ffffffffffffff78,(long)(iVar5 + -2));
            typ_00 = (dattyp)((ulong)in_stack_ffffffffffffff78 >> 0x20);
            if (iVar5 == 0) goto LAB_00137ea8;
          }
          break;
        default:
          goto LAB_00137ea8;
        case '\r':
          uVar8 = osrp2(local_18 + 1);
          typ_00 = (dattyp)((ulong)in_stack_ffffffffffffff78 >> 0x20);
          if (uVar8 == local_38) goto LAB_00137ea8;
        }
      }
      local_18 = local_18 + (int)(uVar7 + 1);
    }
  }
LAB_00137ea8:
  runpush((runcxdef *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),typ_00,
          (runsdef *)in_stack_ffffffffffffff70);
  return;
}

Assistant:

void biffnd(bifcxdef *ctx, int argc)
{
    uchar   *p1, *p2;
    int      len1, len2;
    int      outv;
    runsdef  val;
    int      typ;
    int      siz;
    
    bifcntargs(ctx, 2, argc);
    switch(runtostyp(ctx->bifcxrun))
    {
    case DAT_SSTRING:
        p1 = runpopstr(ctx->bifcxrun);
        len1 = osrp2(p1) - 2;
        p1 += 2;
        
        p2 = runpopstr(ctx->bifcxrun);
        len2 = osrp2(p2) - 2;
        p2 += 2;

        /* look for p2 within p1 */
        for (typ = DAT_NIL, outv = 1 ; len1 >= len2 ; ++p1, --len1, ++outv)
        {
            if (!memcmp(p1, p2, (size_t)len2))
            {
                typ = DAT_NUMBER;           /* use number in outv after all */
                break;                        /* that's it - we've found it */
            }
        }
        break;
        
    case DAT_LIST:
        p1 = runpoplst(ctx->bifcxrun);
        len1 = osrp2(p1) - 2;
        p1 += 2;

        /* get second item:  any old datatype */
        runpop(ctx->bifcxrun, &val);
        
        for (typ = DAT_NIL, outv = 1 ; len1 ; ++outv, p1 += siz, len1 -= siz)
        {
            siz = datsiz(*p1, p1 + 1) + 1;      /* get size of this element */
            if (val.runstyp != *p1) continue;          /* types don't match */
            
            switch(val.runstyp)
            {
            case DAT_NUMBER:
                if (val.runsv.runsvnum != osrp4s(p1 + 1)) continue;
                break;
                
            case DAT_SSTRING:
            case DAT_LIST:
                if (osrp2(p1 + 1) != osrp2(val.runsv.runsvstr) ||
                    memcmp(p1 + 3, val.runsv.runsvstr + 2,
                           (size_t)(osrp2(p1 + 1) - 2)))
                    continue;
                break;
                
            case DAT_PROPNUM:
                if (osrp2(p1 + 1) != val.runsv.runsvprp) continue;
                break;
                
            case DAT_OBJECT:
            case DAT_FNADDR:
                if (osrp2(p1 + 1) != val.runsv.runsvobj) continue;
                break;
                
            default:
                break;
            }
            
            /* if we got here, it means we found a match */
            typ = DAT_NUMBER;                      /* use the value in outv */
            break;                            /* that's it - we've found it */
        }
        break;
        
    default:
        runsig1(ctx->bifcxrun, ERR_INVTBIF, ERRTSTR, "find");
    }
    
    /* push the value given by typ and outv */
    val.runsv.runsvnum = outv;
    runpush(ctx->bifcxrun, typ, &val);
}